

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeBlocksGenerator::GetCBCompilerId_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmMakefile *mf)

{
  cmGlobalGenerator *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  string *psVar4;
  ulong uVar5;
  bool local_21d;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_122;
  undefined1 local_121;
  string *local_120;
  string *compilerId;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string compilerIdVar;
  bool pureFortran;
  allocator<char> local_61;
  string local_60;
  string local_40 [8];
  string userCompiler;
  cmMakefile *mf_local;
  cmExtraCodeBlocksGenerator *this_local;
  string *compiler;
  
  userCompiler.field_2._8_8_ = mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_CODEBLOCKS_COMPILER_ID",&local_61);
  psVar4 = cmMakefile::GetSafeDefinition(mf,&local_60);
  std::__cxx11::string::string(local_40,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
  }
  else {
    compilerIdVar.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)local_a0);
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"CXX",&local_c1);
    bVar3 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    if (bVar3) {
      std::__cxx11::string::operator=((string *)local_a0,"CMAKE_CXX_COMPILER_ID");
    }
    else {
      pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"C",&local_e9);
      bVar3 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      if (bVar3) {
        std::__cxx11::string::operator=((string *)local_a0,"CMAKE_C_COMPILER_ID");
      }
      else {
        pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"Fortran",(allocator<char> *)((long)&compilerId + 7));
        bVar3 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator((allocator<char> *)((long)&compilerId + 7));
        if (bVar3) {
          std::__cxx11::string::operator=((string *)local_a0,"CMAKE_Fortran_COMPILER_ID");
          compilerIdVar.field_2._M_local_buf[0xf] = '\x01';
        }
      }
    }
    local_120 = cmMakefile::GetSafeDefinition
                          ((cmMakefile *)userCompiler.field_2._8_8_,(string *)local_a0);
    local_121 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"gcc",&local_122);
    std::allocator<char>::~allocator(&local_122);
    bVar3 = std::operator==(local_120,"MSVC");
    uVar2 = userCompiler.field_2._8_8_;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"MSVC10",&local_149);
      bVar3 = cmMakefile::IsDefinitionSet((cmMakefile *)uVar2,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      if (bVar3) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"msvc10");
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"msvc8");
      }
    }
    else {
      bVar3 = std::operator==(local_120,"Borland");
      if (bVar3) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"bcc");
      }
      else {
        bVar3 = std::operator==(local_120,"SDCC");
        if (bVar3) {
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,"sdcc");
        }
        else {
          bVar3 = std::operator==(local_120,"Intel");
          uVar2 = userCompiler.field_2._8_8_;
          if (bVar3) {
            local_21d = false;
            if ((compilerIdVar.field_2._M_local_buf[0xf] & 1U) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_170,"WIN32",&local_171);
              local_21d = cmMakefile::IsDefinitionSet((cmMakefile *)uVar2,&local_170);
              std::__cxx11::string::~string((string *)&local_170);
              std::allocator<char>::~allocator(&local_171);
            }
            if (local_21d == false) {
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,"icc");
            }
            else {
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ifcwin");
            }
          }
          else {
            bVar3 = std::operator==(local_120,"Watcom");
            if ((bVar3) || (bVar3 = std::operator==(local_120,"OpenWatcom"), bVar3)) {
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ow");
            }
            else {
              bVar3 = std::operator==(local_120,"Clang");
              if (bVar3) {
                std::__cxx11::string::operator=((string *)__return_storage_ptr__,"clang");
              }
              else {
                bVar3 = std::operator==(local_120,"PGI");
                if (bVar3) {
                  if ((compilerIdVar.field_2._M_local_buf[0xf] & 1U) == 0) {
                    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"pgi");
                  }
                  else {
                    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"pgifortran");
                  }
                }
                else {
                  bVar3 = std::operator==(local_120,"LCC");
                  if (bVar3) {
                    if ((compilerIdVar.field_2._M_local_buf[0xf] & 1U) == 0) {
                      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"lcc");
                    }
                    else {
                      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"lfortran");
                    }
                  }
                  else {
                    bVar3 = std::operator==(local_120,"GNU");
                    if (bVar3) {
                      if ((compilerIdVar.field_2._M_local_buf[0xf] & 1U) == 0) {
                        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"gcc");
                      }
                      else {
                        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"gfortran")
                        ;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_121 = 1;
    std::__cxx11::string::~string((string *)local_a0);
  }
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::GetCBCompilerId(const cmMakefile* mf)
{
  // allow the user to overwrite the detected compiler
  std::string userCompiler =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_COMPILER_ID");
  if (!userCompiler.empty()) {
    return userCompiler;
  }

  // figure out which language to use
  // for now care only for C, C++, and Fortran

  // projects with C/C++ and Fortran are handled as C/C++ projects
  bool pureFortran = false;
  std::string compilerIdVar;
  if (this->GlobalGenerator->GetLanguageEnabled("CXX")) {
    compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("C")) {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("Fortran")) {
    compilerIdVar = "CMAKE_Fortran_COMPILER_ID";
    pureFortran = true;
  }

  std::string const& compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gcc"; // default to gcc
  if (compilerId == "MSVC") {
    if (mf->IsDefinitionSet("MSVC10")) {
      compiler = "msvc10";
    } else {
      compiler = "msvc8";
    }
  } else if (compilerId == "Borland") {
    compiler = "bcc";
  } else if (compilerId == "SDCC") {
    compiler = "sdcc";
  } else if (compilerId == "Intel") {
    if (pureFortran && mf->IsDefinitionSet("WIN32")) {
      compiler = "ifcwin"; // Intel Fortran for Windows (known by cbFortran)
    } else {
      compiler = "icc";
    }
  } else if (compilerId == "Watcom" || compilerId == "OpenWatcom") {
    compiler = "ow";
  } else if (compilerId == "Clang") {
    compiler = "clang";
  } else if (compilerId == "PGI") {
    if (pureFortran) {
      compiler = "pgifortran";
    } else {
      compiler = "pgi"; // does not exist as default in CodeBlocks 16.01
    }
  } else if (compilerId == "LCC") {
    if (pureFortran) {
      compiler = "lfortran";
    } else {
      compiler = "lcc";
    }
  } else if (compilerId == "GNU") {
    if (pureFortran) {
      compiler = "gfortran";
    } else {
      compiler = "gcc";
    }
  }
  return compiler;
}